

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall asmjit::_abi_1_10::Zone::reset(Zone *this,ResetPolicy resetPolicy)

{
  Block *pBVar1;
  Block *pBVar2;
  long lVar3;
  ulong uVar4;
  Block *pBVar5;
  
  pBVar1 = this->_block;
  if (pBVar1 != (Block *)_zeroBlock) {
    if (resetPolicy == kHard) {
      this->_ptr = (uint8_t *)
                   "/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      this->_end = (uint8_t *)
                   "/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      this->_block = (Block *)_zeroBlock;
      pBVar5 = pBVar1->next;
      for (pBVar2 = pBVar1->prev; pBVar2 != (Block *)0x0; pBVar2 = pBVar2->prev) {
        free(pBVar1);
        pBVar1 = pBVar2;
      }
      if (((this->field_3)._packedData & 0x1000000000000000) == 0) {
        free(pBVar1);
      }
      else {
        pBVar1->prev = (Block *)0x0;
        pBVar1->next = (Block *)0x0;
        lVar3 = 1L << (byte)((this->field_3)._packedData >> 0x3d);
        uVar4 = -lVar3;
        this->_ptr = (uint8_t *)((long)&pBVar1->size + lVar3 + 7 & uVar4);
        this->_end = (uint8_t *)((ulong)((long)&pBVar1[1].prev + pBVar1->size) & uVar4);
        this->_block = pBVar1;
      }
      while (pBVar5 != (Block *)0x0) {
        pBVar1 = pBVar5->next;
        free(pBVar5);
        pBVar5 = pBVar1;
      }
    }
    else {
      do {
        pBVar5 = pBVar1;
        pBVar1 = pBVar5->prev;
      } while (pBVar5->prev != (Block *)0x0);
      lVar3 = 1L << (byte)((this->field_3)._packedData >> 0x3d);
      uVar4 = -lVar3;
      this->_ptr = (uint8_t *)((long)&pBVar5->size + lVar3 + 7 & uVar4);
      this->_end = (uint8_t *)((ulong)((long)&pBVar5[1].prev + pBVar5->size) & uVar4);
      this->_block = pBVar5;
    }
  }
  return;
}

Assistant:

void Zone::reset(ResetPolicy resetPolicy) noexcept {
  Block* cur = _block;

  // Can't be altered.
  if (cur == &_zeroBlock)
    return;

  if (resetPolicy == ResetPolicy::kHard) {
    Block* initial = const_cast<Zone::Block*>(&_zeroBlock);
    _ptr = initial->data();
    _end = initial->data();
    _block = initial;

    // Since cur can be in the middle of the double-linked list, we have to traverse both directions (`prev` and
    // `next`) separately to visit all.
    Block* next = cur->next;
    do {
      Block* prev = cur->prev;

      // If this is the first block and this ZoneTmp is temporary then the first block is statically allocated.
      // We cannot free it and it makes sense to keep it even when this is hard reset.
      if (prev == nullptr && _isTemporary) {
        cur->prev = nullptr;
        cur->next = nullptr;
        _assignBlock(cur);
        break;
      }

      ::free(cur);
      cur = prev;
    } while (cur);

    cur = next;
    while (cur) {
      next = cur->next;
      ::free(cur);
      cur = next;
    }
  }
  else {
    while (cur->prev)
      cur = cur->prev;
    _assignBlock(cur);
  }
}